

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O0

void __thiscall
leveldb::anon_unknown_3::DBIter::FindNextUserEntry(DBIter *this,bool skipping,string *skip)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  byte in_SIL;
  DBIter *in_RDI;
  ParsedInternalKey *unaff_retaddr;
  DBIter *in_stack_00000008;
  ParsedInternalKey ikey;
  string *s;
  string *in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa8;
  undefined1 local_48 [16];
  string local_38;
  byte local_9;
  
  local_9 = in_SIL & 1;
  do {
    ParsedInternalKey::ParsedInternalKey((ParsedInternalKey *)0x11f6eb);
    bVar1 = ParseKey(in_stack_00000008,unaff_retaddr);
    if ((bVar1) && (local_38.field_2._M_allocated_capacity <= in_RDI->sequence_)) {
      if (local_38.field_2._8_4_ == 0) {
        SaveKey(in_RDI,(Slice *)(ulong)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
        local_9 = 1;
      }
      else if (local_38.field_2._8_4_ == 1) {
        in_stack_ffffffffffffffa8 = in_stack_ffffffffffffffa8 & 0xffffff;
        if ((local_9 & 1) != 0) {
          s = (string *)in_RDI->user_comparator_;
          in_stack_ffffffffffffffa0 = &local_38;
          Slice::Slice((Slice *)in_stack_ffffffffffffffa0,s);
          iVar2 = (**(code **)(*(long *)s + 0x10))(s,in_stack_ffffffffffffffa0,local_48);
          in_stack_ffffffffffffffa8 = CONCAT13(iVar2 < 1,(int3)in_stack_ffffffffffffffa8);
        }
        if ((char)(in_stack_ffffffffffffffa8 >> 0x18) == '\0') {
          in_RDI->valid_ = true;
          std::__cxx11::string::clear();
          return;
        }
      }
    }
    (*in_RDI->iter_->_vptr_Iterator[6])();
    uVar3 = (*in_RDI->iter_->_vptr_Iterator[2])();
    if ((uVar3 & 1) == 0) {
      std::__cxx11::string::clear();
      in_RDI->valid_ = false;
      return;
    }
  } while( true );
}

Assistant:

void DBIter::FindNextUserEntry(bool skipping, std::string* skip) {
  // Loop until we hit an acceptable entry to yield
  assert(iter_->Valid());
  assert(direction_ == kForward);
  do {
    ParsedInternalKey ikey;
    if (ParseKey(&ikey) && ikey.sequence <= sequence_) {
      switch (ikey.type) {
        case kTypeDeletion:
          // Arrange to skip all upcoming entries for this key since
          // they are hidden by this deletion.
          SaveKey(ikey.user_key, skip);
          skipping = true;
          break;
        case kTypeValue:
          if (skipping &&
              user_comparator_->Compare(ikey.user_key, *skip) <= 0) {
            // Entry hidden
          } else {
            valid_ = true;
            saved_key_.clear();
            return;
          }
          break;
      }
    }
    iter_->Next();
  } while (iter_->Valid());
  saved_key_.clear();
  valid_ = false;
}